

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.h
# Opt level: O3

void __thiscall uWS::HttpResponse<false>::writeUnsigned(HttpResponse<false> *this,uint value)

{
  bool bVar1;
  byte *pbVar2;
  void *pvVar3;
  void *__buf;
  char buf [10];
  char temp [10];
  byte local_14 [9];
  byte abStack_b [11];
  
  __buf = (void *)0x0;
  do {
    (abStack_b + 1)[(long)__buf] = (char)value + (char)(value / 10) * -10 | 0x30;
    __buf = (void *)((long)__buf + 1);
    bVar1 = 9 < value;
    value = value / 10;
  } while (bVar1);
  pbVar2 = local_14;
  pvVar3 = __buf;
  do {
    *pbVar2 = abStack_b[(long)pvVar3];
    pbVar2 = pbVar2 + 1;
    pvVar3 = (void *)((long)pvVar3 + -1);
  } while (pvVar3 != (void *)0x0);
  AsyncSocket<false>::write((AsyncSocket<false> *)this,(int)local_14,__buf,0);
  return;
}

Assistant:

void writeUnsigned(unsigned int value) {
        char buf[10];
        int length = utils::u32toa(value, buf);

        /* For now we do this copy */
        Super::write(buf, length);
    }